

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O1

int amqp_try_recv(amqp_connection_state_t state)

{
  amqp_time_t timeout_00;
  bool bVar1;
  int iVar2;
  amqp_pool_t *pool;
  undefined8 *puVar3;
  amqp_link_t *paVar4;
  amqp_link_t *paVar5;
  int unaff_R14D;
  amqp_time_t timeout;
  amqp_frame_t local_78;
  timeval local_48;
  
  do {
    if (state->sock_inbound_limit <= state->sock_inbound_offset) {
      local_48.tv_sec = 0;
      local_48.tv_usec = 0;
      iVar2 = amqp_time_from_now((amqp_time_t *)&local_78,&local_48);
      if (iVar2 != 0) {
        return iVar2;
      }
      timeout_00.time_point_ns._1_1_ = local_78._1_1_;
      timeout_00.time_point_ns._0_1_ = local_78.frame_type;
      timeout_00.time_point_ns._2_2_ = local_78.channel;
      timeout_00.time_point_ns._4_4_ = local_78._4_4_;
      iVar2 = recv_with_timeout(state,timeout_00);
      return iVar2;
    }
    iVar2 = consume_one_frame(state,&local_78);
    if (iVar2 == 0) {
      bVar1 = true;
      if (local_78.frame_type != '\0') {
        pool = amqp_get_or_create_channel_pool(state,local_78.channel);
        iVar2 = -1;
        if (pool == (amqp_pool_t *)0x0) goto LAB_00108ef2;
        puVar3 = (undefined8 *)amqp_pool_alloc(pool,0x30);
        paVar4 = (amqp_link_t *)amqp_pool_alloc(pool,0x10);
        if (paVar4 == (amqp_link_t *)0x0 || puVar3 == (undefined8 *)0x0) {
          unaff_R14D = iVar2;
          bVar1 = false;
        }
        else {
          puVar3[4] = local_78.payload.properties.raw.len;
          puVar3[5] = local_78.payload.properties.raw.bytes;
          puVar3[2] = local_78.payload.method.decoded;
          puVar3[3] = local_78.payload.properties.decoded;
          *puVar3 = CONCAT44(local_78._4_4_,
                             CONCAT22(local_78.channel,CONCAT11(local_78._1_1_,local_78.frame_type))
                            );
          puVar3[1] = local_78.payload.body_fragment.len;
          paVar4->next = (amqp_link_t_ *)0x0;
          paVar4->data = puVar3;
          paVar5 = state->last_queued_frame;
          if (state->last_queued_frame == (amqp_link_t *)0x0) {
            paVar5 = (amqp_link_t *)&state->first_queued_frame;
          }
          paVar5->next = paVar4;
          state->last_queued_frame = paVar4;
          bVar1 = true;
        }
      }
    }
    else {
LAB_00108ef2:
      unaff_R14D = iVar2;
      bVar1 = false;
    }
    if (!bVar1) {
      return unaff_R14D;
    }
  } while( true );
}

Assistant:

int amqp_try_recv(amqp_connection_state_t state) {
  amqp_time_t timeout;
  int res;

  while (amqp_data_in_buffer(state)) {
    amqp_frame_t frame;
    res = consume_one_frame(state, &frame);

    if (AMQP_STATUS_OK != res) {
      return res;
    }

    if (frame.frame_type != 0) {
      amqp_pool_t *channel_pool;
      amqp_frame_t *frame_copy;
      amqp_link_t *link;

      channel_pool = amqp_get_or_create_channel_pool(state, frame.channel);
      if (NULL == channel_pool) {
        return AMQP_STATUS_NO_MEMORY;
      }

      frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));
      link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));

      if (frame_copy == NULL || link == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }

      *frame_copy = frame;

      link->next = NULL;
      link->data = frame_copy;

      if (state->last_queued_frame == NULL) {
        state->first_queued_frame = link;
      } else {
        state->last_queued_frame->next = link;
      }
      state->last_queued_frame = link;
    }
  }
  res = amqp_time_from_now(&timeout, &(struct timeval){0});
  if (AMQP_STATUS_OK != res) {
    return res;
  }

  return recv_with_timeout(state, timeout);
}